

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseImport
          (Parser *this,
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *dependency,RepeatedField<int> *public_dependency,RepeatedField<int> *weak_dependency,
          LocationRecorder *root_location,FileDescriptorProto *containing_file)

{
  Arena *this_00;
  bool bVar1;
  int iVar2;
  Rep *pRVar3;
  string *output;
  int iVar4;
  Rep *pRVar5;
  LocationRecorder location;
  LocationRecorder local_40;
  
  bVar1 = Consume(this,"import");
  if (!bVar1) {
    return false;
  }
  iVar2 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
  if (iVar2 == 0) {
    LocationRecorder::LocationRecorder(&local_40,root_location,10,public_dependency->current_size_);
    bVar1 = Consume(this,"public");
    if (!bVar1) {
LAB_002ccc38:
      LocationRecorder::~LocationRecorder(&local_40);
      return false;
    }
    iVar2 = (dependency->super_RepeatedPtrFieldBase).current_size_;
    iVar4 = public_dependency->current_size_;
    if (iVar4 == public_dependency->total_size_) {
      RepeatedField<int>::Reserve(public_dependency,iVar4 + 1);
      iVar4 = public_dependency->current_size_;
    }
    pRVar3 = public_dependency->rep_;
    public_dependency->current_size_ = iVar4 + 1;
LAB_002ccbeb:
    pRVar3->elements[iVar4] = iVar2;
    LocationRecorder::~LocationRecorder(&local_40);
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
    if (iVar2 == 0) {
      LocationRecorder::LocationRecorder(&local_40,root_location,0xb,weak_dependency->current_size_)
      ;
      bVar1 = Consume(this,"weak");
      if (!bVar1) goto LAB_002ccc38;
      iVar2 = (dependency->super_RepeatedPtrFieldBase).current_size_;
      iVar4 = weak_dependency->current_size_;
      if (iVar4 == weak_dependency->total_size_) {
        RepeatedField<int>::Reserve(weak_dependency,iVar4 + 1);
        iVar4 = weak_dependency->current_size_;
      }
      pRVar3 = weak_dependency->rep_;
      weak_dependency->current_size_ = iVar4 + 1;
      goto LAB_002ccbeb;
    }
  }
  LocationRecorder::LocationRecorder
            (&local_40,root_location,3,(dependency->super_RepeatedPtrFieldBase).current_size_);
  pRVar5 = (dependency->super_RepeatedPtrFieldBase).rep_;
  if (pRVar5 == (Rep *)0x0) {
    iVar2 = (dependency->super_RepeatedPtrFieldBase).total_size_;
LAB_002ccc55:
    internal::RepeatedPtrFieldBase::Reserve(&dependency->super_RepeatedPtrFieldBase,iVar2 + 1);
    pRVar5 = (dependency->super_RepeatedPtrFieldBase).rep_;
    iVar2 = pRVar5->allocated_size;
  }
  else {
    iVar4 = (dependency->super_RepeatedPtrFieldBase).current_size_;
    iVar2 = pRVar5->allocated_size;
    if (iVar4 < iVar2) {
      (dependency->super_RepeatedPtrFieldBase).current_size_ = iVar4 + 1;
      output = (string *)pRVar5->elements[iVar4];
      goto LAB_002ccce9;
    }
    if (iVar2 == (dependency->super_RepeatedPtrFieldBase).total_size_) goto LAB_002ccc55;
  }
  pRVar5->allocated_size = iVar2 + 1;
  this_00 = (dependency->super_RepeatedPtrFieldBase).arena_;
  if (this_00 == (Arena *)0x0) {
    output = (string *)operator_new(0x20);
    (output->_M_dataplus)._M_p = (pointer)&output->field_2;
    output->_M_string_length = 0;
    (output->field_2)._M_local_buf[0] = '\0';
  }
  else {
    output = (string *)
             Arena::AllocateAligned(this_00,(type_info *)&std::__cxx11::string::typeinfo,0x20);
    (output->_M_dataplus)._M_p = (pointer)&output->field_2;
    output->_M_string_length = 0;
    (output->field_2)._M_local_buf[0] = '\0';
    Arena::AddListNode(this_00,output,internal::arena_destruct_object<std::__cxx11::string>);
    pRVar5 = (dependency->super_RepeatedPtrFieldBase).rep_;
  }
  iVar2 = (dependency->super_RepeatedPtrFieldBase).current_size_;
  (dependency->super_RepeatedPtrFieldBase).current_size_ = iVar2 + 1;
  pRVar5->elements[iVar2] = output;
LAB_002ccce9:
  bVar1 = ConsumeString(this,output,"Expected a string naming the file to import.");
  if (bVar1) {
    LocationRecorder::EndAt(&local_40,&this->input_->previous_);
    bVar1 = ConsumeEndOfDeclaration(this,";",&local_40);
  }
  else {
    bVar1 = false;
  }
  LocationRecorder::~LocationRecorder(&local_40);
  return bVar1;
}

Assistant:

bool Parser::ParseImport(RepeatedPtrField<string>* dependency,
                         RepeatedField<int32>* public_dependency,
                         RepeatedField<int32>* weak_dependency,
                         const LocationRecorder& root_location,
                         const FileDescriptorProto* containing_file) {
  DO(Consume("import"));
  if (LookingAt("public")) {
    LocationRecorder location(
        root_location, FileDescriptorProto::kPublicDependencyFieldNumber,
        public_dependency->size());
    DO(Consume("public"));
    *public_dependency->Add() = dependency->size();
  } else if (LookingAt("weak")) {
    LocationRecorder location(
        root_location, FileDescriptorProto::kWeakDependencyFieldNumber,
        weak_dependency->size());
    DO(Consume("weak"));
    *weak_dependency->Add() = dependency->size();
  }
  {
    LocationRecorder location(root_location,
                              FileDescriptorProto::kDependencyFieldNumber,
                              dependency->size());
    DO(ConsumeString(dependency->Add(),
      "Expected a string naming the file to import."));

    location.EndAt(input_->previous());

    DO(ConsumeEndOfDeclaration(";", &location));
  }
  return true;
}